

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_win_lock_(MPIABI_Fint *lock_type,MPIABI_Fint *rank,MPIABI_Fint *assert,MPIABI_Fint *win,
                     MPIABI_Fint *ierror)

{
  mpi_win_lock_();
  return;
}

Assistant:

void mpiabi_win_lock_(
  const MPIABI_Fint * lock_type,
  const MPIABI_Fint * rank,
  const MPIABI_Fint * assert,
  const MPIABI_Fint * win,
  MPIABI_Fint * ierror
) {
  return mpi_win_lock_(
    lock_type,
    rank,
    assert,
    win,
    ierror
  );
}